

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cEnhancedLayoutsTests.cpp
# Opt level: O0

void __thiscall
gl4cts::EnhancedLayouts::Utils::Variable::Descriptor::Descriptor
          (Descriptor *this,GLchar *name,GLchar *qualifiers,GLint expected_component,
          GLint expected_location,Type *type,GLboolean normalized,GLuint n_array_elements,
          GLint expected_stride_of_element,GLuint offset)

{
  char *__s;
  allocator<char> local_45 [20];
  allocator<char> local_31;
  Type *local_30;
  Type *type_local;
  GLint expected_location_local;
  GLint expected_component_local;
  GLchar *qualifiers_local;
  GLchar *name_local;
  Descriptor *this_local;
  
  this->m_expected_component = expected_component;
  this->m_expected_location = expected_location;
  this->m_expected_stride_of_element = expected_stride_of_element;
  this->m_n_array_elements = n_array_elements;
  local_30 = type;
  type_local._0_4_ = expected_location;
  type_local._4_4_ = expected_component;
  _expected_location_local = qualifiers;
  qualifiers_local = name;
  name_local = (GLchar *)this;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_name,name,&local_31);
  std::allocator<char>::~allocator(&local_31);
  __s = _expected_location_local;
  this->m_normalized = normalized;
  this->m_offset = offset;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->m_qualifiers,__s,local_45);
  std::allocator<char>::~allocator(local_45);
  this->m_type = BUILTIN;
  (this->field_9).m_interface = *(Interface **)local_30;
  (this->field_9).m_builtin.m_n_rows = local_30->m_n_rows;
  return;
}

Assistant:

Variable::Descriptor::Descriptor(const GLchar* name, const GLchar* qualifiers, GLint expected_component,
								 GLint expected_location, const Type& type, GLboolean normalized,
								 GLuint n_array_elements, GLint expected_stride_of_element, GLuint offset)
	: m_expected_component(expected_component)
	, m_expected_location(expected_location)
	, m_expected_stride_of_element(expected_stride_of_element)
	, m_n_array_elements(n_array_elements)
	, m_name(name)
	, m_normalized(normalized)
	, m_offset(offset)
	, m_qualifiers(qualifiers)
	, m_type(BUILTIN)
	, m_builtin(type)
{
}